

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<char_const(&)[2]>
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,char (*args) [2])

{
  size_type sVar1;
  pointer ppVar2;
  
  if (this->len == this->cap) {
    ppVar2 = emplaceRealloc<char_const(&)[2]>(this,this->data_ + this->len,args);
    return ppVar2;
  }
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            (this->data_ + this->len,args,auto_format);
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }